

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

saint_t sufcheck(sauchar_t *T,saidx_t *SA,saidx_t n,saint_t verbose)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  saint_t sVar12;
  saidx_t C [256];
  
  if (verbose != 0) {
    sufcheck_cold_1();
  }
  if ((SA == (saidx_t *)0x0 || T == (sauchar_t *)0x0) || n < 0) {
    sVar12 = -1;
    if (verbose != 0) {
      sufcheck_cold_4();
    }
  }
  else if (n == 0) {
    sVar12 = 0;
    if (verbose != 0) {
      sufcheck_cold_3();
    }
  }
  else {
    uVar5 = 0;
    do {
      if ((uint)n <= (uint)SA[uVar5]) {
        if (verbose == 0) {
          return -2;
        }
        fprintf(_stderr,"Out of the range [0,%d].\n  SA[%d]=%d\n",(ulong)(n - 1));
        return -2;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
    if (1 < n) {
      lVar6 = 0;
      do {
        if (T[SA[lVar6 + 1]] < T[SA[lVar6]]) {
          if (verbose == 0) {
            return -3;
          }
          fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%d]=%d]=%d > T[SA[%d]=%d]=%d\n");
          return -3;
        }
        lVar6 = lVar6 + 1;
      } while ((ulong)(uint)n - 1 != lVar6);
    }
    uVar11 = 0;
    memset(C,0,0x400);
    uVar5 = 1;
    if (1 < n) {
      uVar5 = (ulong)(uint)n;
    }
    do {
      C[T[uVar11]] = C[T[uVar11]] + 1;
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
    lVar6 = 0;
    iVar4 = 0;
    do {
      iVar10 = C[lVar6];
      C[lVar6] = iVar4;
      lVar6 = lVar6 + 1;
      iVar4 = iVar10 + iVar4;
    } while (lVar6 != 0x100);
    bVar1 = T[n - 1U];
    uVar2 = C[bVar1];
    C[bVar1] = uVar2 + 1;
    uVar5 = 1;
    if (1 < n) {
      uVar5 = (ulong)(uint)n;
    }
    uVar11 = 0;
    do {
      uVar8 = (ulong)bVar1;
      uVar9 = n - 1U;
      uVar3 = uVar2;
      if (0 < SA[uVar11]) {
        uVar9 = SA[uVar11] - 1;
        uVar8 = (ulong)T[uVar9];
        uVar3 = C[uVar8];
      }
      uVar7 = (ulong)uVar3;
      if (((int)uVar3 < 0) || (uVar9 != SA[uVar7])) {
        if (verbose == 0) {
          return -4;
        }
        uVar5 = 0xffffffff;
        if (-1 < (int)uVar3) {
          uVar5 = (ulong)(uint)SA[uVar7];
        }
        fprintf(_stderr,"Suffix in wrong position.\n  SA[%d]=%d or\n  SA[%d]=%d\n",uVar7,uVar5);
        return -4;
      }
      if (uVar3 != uVar2) {
        iVar4 = C[uVar8];
        iVar10 = iVar4 + 1;
        C[uVar8] = iVar10;
        if ((n <= iVar10) || (T[SA[(long)iVar4 + 1]] != (sauchar_t)uVar8)) {
          C[uVar8] = -1;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
    sVar12 = 0;
    if (0 < verbose) {
      sufcheck_cold_2();
      sVar12 = 0;
    }
  }
  return sVar12;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}